

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

int __thiscall
asmjit::v1_14::BaseAssembler::bind(BaseAssembler *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Error err_00;
  undefined4 in_register_00000034;
  BaseEmitter *this_00;
  Error err;
  uint64_t in_stack_00000040;
  uint32_t in_stack_0000004c;
  Label *in_stack_00000050;
  CodeHolder *in_stack_00000058;
  Label *in_stack_00000230;
  BaseAssembler *in_stack_00000238;
  Error in_stack_ffffffffffffffcc;
  Error local_1c;
  
  this_00 = (BaseEmitter *)CONCAT44(in_register_00000034,__fd);
  if ((this->super_BaseEmitter)._code == (CodeHolder *)0x0) {
    DebugUtils::errored(5);
    local_1c = BaseEmitter::reportError(this_00,in_stack_ffffffffffffffcc,(char *)this);
  }
  else {
    err_00 = CodeHolder::bindLabel
                       (in_stack_00000058,in_stack_00000050,in_stack_0000004c,in_stack_00000040);
    if ((this->super_BaseEmitter)._logger != (Logger *)0x0) {
      EmitterUtils::logLabelBound(in_stack_00000238,in_stack_00000230);
    }
    (this->super_BaseEmitter)._inlineComment = (char *)0x0;
    if (err_00 == 0) {
      local_1c = 0;
    }
    else {
      local_1c = BaseEmitter::reportError(this_00,err_00,(char *)this);
    }
  }
  return local_1c;
}

Assistant:

Error BaseAssembler::bind(const Label& label) {
  if (ASMJIT_UNLIKELY(!_code))
    return reportError(DebugUtils::errored(kErrorNotInitialized));

  Error err = _code->bindLabel(label, _section->id(), offset());

#ifndef ASMJIT_NO_LOGGING
  if (_logger)
    EmitterUtils::logLabelBound(this, label);
#endif

  resetInlineComment();
  if (err)
    return reportError(err);

  return kErrorOk;
}